

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp,OPJ_FLOAT64 *mct_norms
                            ,OPJ_UINT32 mct_numcomps)

{
  OPJ_INT32 *pOVar1;
  opj_flag_t oVar2;
  opj_tcd_tilecomp_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  opj_tcd_pass_t *poVar6;
  bool bVar7;
  OPJ_UINT32 OVar8;
  OPJ_INT32 OVar9;
  OPJ_BOOL OVar10;
  OPJ_UINT32 OVar11;
  byte bVar12;
  uint uVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  opj_flag_t *poVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  OPJ_UINT32 OVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint *puVar31;
  opj_tcd_tilecomp_t *poVar32;
  opj_mqc_state_t **ppoVar33;
  OPJ_INT16 *pOVar34;
  float fVar35;
  double dVar36;
  OPJ_BYTE type;
  opj_mqc_t *mqc;
  OPJ_INT32 local_178;
  uint local_174;
  OPJ_FLOAT64 local_170;
  char local_162;
  byte local_161;
  ulong local_160;
  int local_158;
  uint local_154;
  ulong local_150;
  uint local_144;
  ulong local_140;
  opj_tcd_band_t *local_138;
  opj_tcd_cblk_enc_t *local_130;
  OPJ_UINT32 local_124;
  OPJ_UINT32 local_120;
  int local_11c;
  opj_tccp_t *local_118;
  opj_mqc_state_t **local_110;
  opj_tcd_resolution_t *local_108;
  opj_tcd_tilecomp_t *local_100;
  opj_tcd_tile_t *local_f8;
  OPJ_UINT32 local_f0;
  uint local_ec;
  ulong local_e8;
  OPJ_UINT32 *local_e0;
  ulong local_d8;
  OPJ_FLOAT64 *local_d0;
  double local_c8;
  opj_tcd_pass_t *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  opj_tcp_t *local_a0;
  ulong local_98;
  ulong local_90;
  opj_tcd_band_t *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  opj_tcd_precinct_t *local_68;
  ulong local_60;
  ulong local_58;
  double local_50;
  opj_mqc_state_t **local_48;
  opj_mqc_state_t **local_40;
  ulong local_38;
  
  tile->distotile = 0.0;
  uVar25 = tile->numcomps;
  if (uVar25 != 0) {
    local_40 = (t1->mqc).ctxs + 0x11;
    local_48 = (t1->mqc).ctxs + 0x12;
    local_110 = (t1->mqc).ctxs;
    uVar17 = (ulong)mct_numcomps;
    uVar29 = 0;
    local_f8 = tile;
    local_d0 = mct_norms;
    local_a8 = uVar17;
    local_a0 = tcp;
    do {
      poVar3 = local_f8->comps;
      uVar24 = poVar3[uVar29].numresolutions;
      if (uVar24 != 0) {
        poVar32 = poVar3 + uVar29;
        local_f0 = poVar3[uVar29].x1 - poVar3[uVar29].x0;
        uVar30 = (ulong)local_f0;
        local_118 = tcp->tccps + uVar29;
        local_70 = (ulong)local_f0;
        local_162 = uVar29 < uVar17 && local_d0 != (OPJ_FLOAT64 *)0x0;
        local_98 = 0;
        local_100 = poVar32;
        local_d8 = uVar29;
        do {
          if (poVar32->resolutions[local_98].numbands != 0) {
            local_108 = poVar32->resolutions + local_98;
            local_88 = local_108->bands;
            local_e8 = (ulong)((uint)local_98 - 1);
            local_ec = ~(uint)local_98;
            local_80 = 0;
            do {
              local_138 = local_88 + local_80;
              OVar10 = opj_tcd_is_band_empty(local_138);
              if (OVar10 == 0) {
                OVar14 = local_108->pw;
                OVar11 = local_108->ph;
                if (OVar11 * OVar14 != 0) {
                  fVar35 = floorf((float)local_138->stepsize * 8192.0);
                  local_78 = (long)(int)(0x4000000 / (long)(int)fVar35);
                  uVar17 = 0;
                  do {
                    poVar4 = local_138->precincts;
                    if (poVar4[uVar17].ch * poVar4[uVar17].cw != 0) {
                      local_68 = poVar4 + uVar17;
                      uVar29 = 0;
                      local_90 = uVar17;
                      do {
                        poVar5 = (local_68->cblks).enc;
                        iVar19 = poVar5[uVar29].x0 - local_138->x0;
                        if ((local_138->bandno & 1) != 0) {
                          iVar19 = (iVar19 + poVar32->resolutions[local_e8].x1) -
                                   poVar32->resolutions[local_e8].x0;
                        }
                        iVar20 = poVar5[uVar29].y0 - local_138->y0;
                        if ((local_138->bandno & 2) != 0) {
                          iVar20 = (iVar20 + poVar32->resolutions[local_e8].y1) -
                                   poVar32->resolutions[local_e8].y0;
                        }
                        local_130 = poVar5 + uVar29;
                        local_60 = uVar29;
                        OVar10 = opj_t1_allocate_buffers
                                           (t1,local_130->x1 - poVar5[uVar29].x0,
                                            local_130->y1 - poVar5[uVar29].y0);
                        ppoVar33 = local_110;
                        poVar5 = local_130;
                        if (OVar10 == 0) {
                          return 0;
                        }
                        OVar14 = t1->w;
                        OVar11 = t1->h;
                        pOVar1 = poVar32->data + (long)iVar20 * local_70 + (long)iVar19;
                        t1->data = pOVar1;
                        t1->data_stride = local_f0;
                        if (local_118->qmfbid == 1) {
                          if (OVar11 == 0) {
                            uVar17 = CONCAT71((int7)(uVar30 >> 8),1);
                          }
                          else {
                            lVar26 = 0;
                            OVar27 = 0;
                            OVar8 = OVar14;
                            do {
                              for (; OVar8 != 0; OVar8 = OVar8 - 1) {
                                pOVar1[lVar26] = pOVar1[lVar26] << 6;
                                lVar26 = lVar26 + 1;
                              }
                              lVar26 = lVar26 + (ulong)(local_f0 - OVar14);
                              OVar27 = OVar27 + 1;
                              OVar8 = OVar14;
                            } while (OVar27 != OVar11);
LAB_00127270:
                            uVar17 = CONCAT71((int7)(uVar30 >> 8),local_118->qmfbid == 1);
                          }
                        }
                        else {
                          uVar17 = 0;
                          if (OVar11 != 0) {
                            lVar26 = 0;
                            OVar8 = OVar14;
                            uVar30 = uVar17;
                            do {
                              for (; OVar8 != 0; OVar8 = OVar8 - 1) {
                                lVar23 = pOVar1[lVar26] * local_78 + 0x1000 >> 0x12;
                                if (0x7fffffff < lVar23) {
                                  __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) <= (OPJ_INT64)0x7FFFFFFF"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                                ,0x107,
                                                "OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)"
                                               );
                                }
                                if (lVar23 < -0x80000000) {
                                  __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                                ,0x109,
                                                "OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)"
                                               );
                                }
                                pOVar1[lVar26] = (OPJ_INT32)lVar23;
                                lVar26 = lVar26 + 1;
                              }
                              lVar26 = lVar26 + (ulong)(local_f0 - OVar14);
                              uVar25 = (int)uVar30 + 1;
                              uVar30 = (ulong)uVar25;
                              OVar8 = OVar14;
                            } while (uVar25 != OVar11);
                            goto LAB_00127270;
                          }
                        }
                        local_120 = local_138->bandno;
                        local_50 = (double)(float)local_138->stepsize;
                        local_124 = local_100->numresolutions + local_ec;
                        local_140 = (ulong)local_118->cblksty;
                        (t1->mqc).lut_ctxno_zc_orient = "" + (local_120 << 9);
                        uVar30 = uVar17;
                        if (t1->w == 0) {
LAB_0012736d:
                          local_130->numbps = 0;
LAB_00127379:
                          poVar5->totalpasses = 0;
                          poVar32 = local_100;
                        }
                        else {
                          uVar25 = 0;
                          uVar24 = 0;
                          do {
                            if ((ulong)t1->h != 0) {
                              uVar29 = (ulong)t1->h;
                              uVar28 = uVar24;
                              do {
                                uVar13 = pOVar1[uVar28];
                                uVar30 = (ulong)uVar13;
                                uVar21 = -uVar13;
                                if (0 < (int)uVar13) {
                                  uVar21 = uVar13;
                                }
                                if ((int)uVar25 <= (int)uVar21) {
                                  uVar25 = uVar21;
                                }
                                uVar28 = uVar28 + t1->data_stride;
                                uVar29 = uVar29 - 1;
                              } while (uVar29 != 0);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar24 != t1->w);
                          local_58 = uVar17;
                          if (uVar25 == 0) goto LAB_0012736d;
                          if (1 < (int)uVar25) {
                            OVar14 = 0xfffffffb;
                            uVar17 = (ulong)uVar25;
                            do {
                              uVar17 = uVar17 >> 1;
                              OVar14 = OVar14 + 1;
                              bVar7 = 3 < uVar25;
                              uVar25 = (uint)uVar17;
                            } while (bVar7);
                            local_130->numbps = OVar14;
                            if (OVar14 != 0) goto LAB_001273cd;
                            goto LAB_00127379;
                          }
                          local_130->numbps = 0xfffffffb;
                          OVar14 = 0xfffffffb;
LAB_001273cd:
                          local_e0 = &local_130->numbps;
                          opj_mqc_resetstates(&t1->mqc);
                          opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
                          opj_mqc_setstate(&t1->mqc,0x11,0,3);
                          opj_mqc_setstate(&t1->mqc,0,0,4);
                          opj_mqc_init_enc(&t1->mqc,poVar5->data);
                          iVar19 = OVar14 - 1;
                          if (iVar19 < 0) goto LAB_00127379;
                          local_161 = (byte)local_140 & 1;
                          local_b0 = (ulong)((uint)local_140 & 8);
                          local_144 = (uint)local_140 & 0x10;
                          uVar25 = 2;
                          uVar17 = 0;
                          local_c8 = 0.0;
                          do {
                            local_c0 = local_130->passes;
                            local_174 = (uint)local_161;
                            if ((int)(local_130->numbps - 4) <= iVar19) {
                              local_174 = 0;
                            }
                            if (1 < uVar25) {
                              local_174 = 0;
                            }
                            if (((int)uVar17 != 0) &&
                               ((local_c0[(int)uVar17 - 1].field_0x14 & 1) != 0)) {
                              if ((byte)local_174 == '\0') {
                                opj_mqc_restart_init_enc(&t1->mqc);
                              }
                              else {
                                opj_mqc_bypass_init_enc(&t1->mqc);
                              }
                            }
                            bVar12 = (byte)iVar19;
                            uVar24 = 0x40 << (bVar12 & 0x1f);
                            local_170 = (OPJ_FLOAT64)CONCAT44(local_170._4_4_,uVar24);
                            local_154 = uVar25;
                            local_b8 = uVar17;
                            if (uVar25 == 2) {
                              local_178 = 0;
                              uVar25 = t1->h;
                              uVar17 = 0;
                              if (3 < uVar25) {
                                uVar28 = t1->w;
                                uVar17 = 0;
                                uVar13 = uVar28;
                                do {
                                  if (uVar13 == 0) {
                                    uVar13 = 0;
                                  }
                                  else {
                                    local_150 = (ulong)((int)(uVar17 >> 2) + 1);
                                    local_160 = uVar17;
                                    uVar25 = 0;
                                    do {
                                      iVar20 = (int)local_160;
                                      poVar16 = t1->flags;
                                      uVar21 = uVar25 + 1;
                                      iVar22 = (int)local_150;
                                      oVar2 = poVar16[(uVar13 + 2) * iVar22 + uVar25 + 1];
                                      OVar14 = 0;
                                      if (oVar2 == 0) {
                                        uVar28 = iVar20 * t1->data_stride + uVar25;
                                        uVar17 = 0;
                                        do {
                                          uVar13 = t1->data[uVar28];
                                          uVar15 = -uVar13;
                                          if (0 < (int)uVar13) {
                                            uVar15 = uVar13;
                                          }
                                          if ((uVar15 & uVar24) != 0) goto LAB_00127d24;
                                          uVar17 = uVar17 + 1;
                                          uVar28 = uVar28 + t1->data_stride;
                                        } while (uVar17 != 4);
                                        uVar17 = 4;
LAB_00127d24:
                                        (t1->mqc).curctx = local_40;
                                        OVar14 = (OPJ_UINT32)uVar17;
                                        opj_mqc_encode(&t1->mqc,(uint)(OVar14 != 4));
                                        if (OVar14 != 4) {
                                          (t1->mqc).curctx = local_48;
                                          opj_mqc_encode(&t1->mqc,(uint)(uVar17 >> 1) & 0x7fffffff);
                                          opj_mqc_encode(&t1->mqc,OVar14 & 1);
                                          poVar16 = t1->flags;
                                          uVar28 = t1->w;
                                          iVar20 = (int)local_160;
                                          iVar22 = (int)local_150;
                                          uVar24 = local_170._0_4_;
                                          goto LAB_00127d9e;
                                        }
                                      }
                                      else {
LAB_00127d9e:
                                        opj_t1_enc_clnpass_step
                                                  (t1,poVar16 + ((uVar28 + 2) * iVar22 + uVar21),
                                                   t1->data +
                                                   ((OVar14 + iVar20) * t1->data_stride + uVar25),
                                                   iVar19,uVar24,&local_178,(uint)(oVar2 == 0),
                                                   OVar14,4,(OPJ_UINT32)local_140);
                                      }
                                      uVar28 = t1->w;
                                      uVar24 = local_170._0_4_;
                                      uVar13 = uVar28;
                                      uVar25 = uVar21;
                                    } while (uVar21 < uVar28);
                                    uVar25 = t1->h;
                                    uVar17 = local_160;
                                  }
                                  uVar17 = uVar17 + 4;
                                } while (uVar17 < (uVar25 & 0xfffffffc));
                              }
                              uVar29 = local_140;
                              uVar28 = (uint)uVar17;
                              if ((uVar28 < uVar25) && (uVar25 = t1->w, uVar25 != 0)) {
                                local_160 = CONCAT44(local_160._4_4_,
                                                     ((uint)(uVar17 >> 2) & 0x3fffffff) + 1);
                                uVar13 = 0;
                                do {
                                  uVar21 = uVar13 + 1;
                                  opj_t1_enc_clnpass_step
                                            (t1,t1->flags +
                                                (uVar13 + (uVar25 + 2) * (uint)local_160 + 1),
                                             t1->data + (t1->data_stride * uVar28 + uVar13),iVar19,
                                             uVar24,&local_178,0,0,t1->h - uVar28,(OPJ_UINT32)uVar29
                                            );
                                  uVar25 = t1->w;
                                  uVar24 = local_170._0_4_;
                                  uVar13 = uVar21;
                                } while (uVar21 < uVar25);
                              }
                              uVar30 = 0;
                              if ((uVar29 & 0x20) != 0) {
                                opj_mqc_segmark_enc(&t1->mqc);
                              }
                            }
                            else if (uVar25 == 1) {
                              uVar25 = t1->w;
                              puVar31 = t1->flags + (uVar25 + 3);
                              local_178 = 0;
                              uVar28 = t1->h;
                              if (uVar28 < 4) {
                                uVar13 = 0;
                              }
                              else {
                                pOVar34 = lut_nmsedec_ref;
                                if (iVar19 == 0) {
                                  pOVar34 = lut_nmsedec_ref0;
                                }
                                uVar13 = 0;
                                local_160 = CONCAT44(local_160._4_4_,1);
                                local_150 = CONCAT44(local_150._4_4_,2);
                                local_158 = 3;
                                uVar21 = uVar25;
                                do {
                                  if (uVar21 == 0) {
                                    uVar21 = 0;
                                  }
                                  else {
                                    uVar28 = 0;
                                    do {
                                      uVar25 = *puVar31;
                                      if ((~uVar25 & 0x49200000) != 0 && (uVar25 & 0x2490) != 0) {
                                        if ((uVar25 & 0x200010) == 0x10) {
                                          uVar21 = t1->data[t1->data_stride * uVar13 + uVar28];
                                          uVar15 = -uVar21;
                                          if (0 < (int)uVar21) {
                                            uVar15 = uVar21;
                                          }
                                          local_178 = local_178 +
                                                      pOVar34[uVar15 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar21 = 0xf - ((uVar25 & 0x1ef) == 0);
                                          if ((uVar25 >> 0x14 & 1) != 0) {
                                            uVar21 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar33 + uVar21;
                                          uVar25 = (uint)((uVar15 & uVar24) != 0);
                                          if ((byte)local_174 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar25);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar25);
                                          }
                                          uVar25 = *puVar31 | 0x100000;
                                          *puVar31 = uVar25;
                                          uVar24 = local_170._0_4_;
                                        }
                                        if ((uVar25 & 0x1000080) == 0x80) {
                                          uVar21 = t1->data[t1->data_stride * (uint)local_160 +
                                                            uVar28];
                                          uVar15 = -uVar21;
                                          if (0 < (int)uVar21) {
                                            uVar15 = uVar21;
                                          }
                                          local_178 = local_178 +
                                                      pOVar34[uVar15 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar21 = 0xf - ((uVar25 & 0xf78) == 0);
                                          if ((uVar25 >> 0x17 & 1) != 0) {
                                            uVar21 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar33 + uVar21;
                                          uVar25 = (uint)((uVar15 & uVar24) != 0);
                                          if ((byte)local_174 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar25);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar25);
                                          }
                                          uVar25 = *puVar31 | 0x800000;
                                          *puVar31 = uVar25;
                                          uVar24 = local_170._0_4_;
                                        }
                                        if ((uVar25 & 0x8000400) == 0x400) {
                                          uVar21 = t1->data[t1->data_stride * (int)local_150 +
                                                            uVar28];
                                          uVar15 = -uVar21;
                                          if (0 < (int)uVar21) {
                                            uVar15 = uVar21;
                                          }
                                          local_178 = local_178 +
                                                      pOVar34[uVar15 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar21 = 0xf - ((uVar25 & 0x7bc0) == 0);
                                          if ((uVar25 >> 0x1a & 1) != 0) {
                                            uVar21 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar33 + uVar21;
                                          uVar25 = (uint)((uVar15 & uVar24) != 0);
                                          if ((byte)local_174 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar25);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar25);
                                          }
                                          uVar25 = *puVar31 | 0x4000000;
                                          *puVar31 = uVar25;
                                          uVar24 = local_170._0_4_;
                                        }
                                        if ((uVar25 & 0x40002000) == 0x2000) {
                                          uVar21 = t1->data[t1->data_stride * local_158 + uVar28];
                                          uVar15 = -uVar21;
                                          if (0 < (int)uVar21) {
                                            uVar15 = uVar21;
                                          }
                                          local_178 = local_178 +
                                                      pOVar34[uVar15 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar21 = 0xf - ((uVar25 & 0x3de00) == 0);
                                          if ((uVar25 >> 0x1d & 1) != 0) {
                                            uVar21 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar33 + uVar21;
                                          uVar25 = (uint)((uVar15 & uVar24) != 0);
                                          if ((byte)local_174 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar25);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar25);
                                          }
                                          *(byte *)((long)puVar31 + 3) =
                                               *(byte *)((long)puVar31 + 3) | 0x20;
                                          uVar24 = local_170._0_4_;
                                        }
                                      }
                                      puVar31 = puVar31 + 1;
                                      uVar28 = uVar28 + 1;
                                      uVar25 = t1->w;
                                    } while (uVar28 < uVar25);
                                    uVar28 = t1->h;
                                    uVar21 = uVar25;
                                  }
                                  puVar31 = puVar31 + 2;
                                  uVar13 = uVar13 + 4;
                                  local_160 = CONCAT44(local_160._4_4_,(uint)local_160 + 4);
                                  local_150 = CONCAT44(local_150._4_4_,(int)local_150 + 4);
                                  local_158 = local_158 + 4;
                                } while (uVar13 < (uVar28 & 0xfffffffc));
                              }
                              if (uVar25 != 0 && uVar13 < uVar28) {
                                pOVar34 = lut_nmsedec_ref;
                                if (iVar19 == 0) {
                                  pOVar34 = lut_nmsedec_ref0;
                                }
                                uVar21 = 0;
                                local_160 = CONCAT44(local_160._4_4_,uVar13);
                                do {
                                  uVar15 = *puVar31;
                                  if (((uVar15 & 0x2490) != 0) && (uVar13 < uVar28)) {
                                    bVar18 = 0;
                                    do {
                                      uVar25 = uVar15 >> (bVar18 & 0x1f);
                                      if ((uVar25 & 0x200010) == 0x10) {
                                        uVar28 = t1->data[t1->data_stride * uVar13 + uVar21];
                                        uVar15 = -uVar28;
                                        if (0 < (int)uVar28) {
                                          uVar15 = uVar28;
                                        }
                                        local_178 = local_178 +
                                                    pOVar34[uVar15 >> (bVar12 & 0x1f) & 0x7f];
                                        uVar28 = 0xf - ((uVar25 & 0x1ef) == 0);
                                        if ((uVar25 >> 0x14 & 1) != 0) {
                                          uVar28 = 0x10;
                                        }
                                        (t1->mqc).curctx = local_110 + uVar28;
                                        uVar25 = (uint)((uVar15 & uVar24) != 0);
                                        if ((byte)local_174 == '\0') {
                                          opj_mqc_encode(&t1->mqc,uVar25);
                                        }
                                        else {
                                          opj_mqc_bypass_enc(&t1->mqc,uVar25);
                                        }
                                        uVar15 = 0x100000 << (bVar18 & 0x1f) | *puVar31;
                                        *puVar31 = uVar15;
                                        uVar28 = t1->h;
                                        uVar24 = local_170._0_4_;
                                      }
                                      uVar13 = uVar13 + 1;
                                      bVar18 = bVar18 + 3;
                                    } while (uVar13 < uVar28);
                                    uVar25 = t1->w;
                                    uVar13 = (uint)local_160;
                                  }
                                  puVar31 = puVar31 + 1;
                                  uVar21 = uVar21 + 1;
                                } while (uVar21 < uVar25);
                              }
                            }
                            else {
                              uVar25 = t1->w;
                              poVar16 = t1->flags + (uVar25 + 3);
                              local_178 = 0;
                              uVar28 = t1->h;
                              uVar13 = 0;
                              local_160 = (ulong)(byte)local_174;
                              if (3 < uVar28) {
                                uVar17 = 0;
                                local_150 = CONCAT44(local_150._4_4_,3);
                                local_158 = 2;
                                local_11c = 1;
                                uVar21 = uVar25;
                                do {
                                  if (uVar21 == 0) {
                                    uVar21 = 0;
                                  }
                                  else {
                                    uVar28 = 0;
                                    local_38 = uVar17;
                                    do {
                                      if (*poVar16 != 0) {
                                        type = (OPJ_BYTE)local_160;
                                        opj_t1_enc_sigpass_step
                                                  (t1,poVar16,
                                                   t1->data +
                                                   (t1->data_stride * (int)uVar17 + uVar28),iVar19,
                                                   uVar24,&local_178,type,0,(OPJ_UINT32)local_b0);
                                        opj_t1_enc_sigpass_step
                                                  (t1,poVar16,
                                                   t1->data + (t1->data_stride * local_11c + uVar28)
                                                   ,iVar19,local_170._0_4_,&local_178,type,1,0);
                                        opj_t1_enc_sigpass_step
                                                  (t1,poVar16,
                                                   t1->data + (t1->data_stride * local_158 + uVar28)
                                                   ,iVar19,local_170._0_4_,&local_178,type,2,0);
                                        opj_t1_enc_sigpass_step
                                                  (t1,poVar16,
                                                   t1->data +
                                                   (t1->data_stride * (int)local_150 + uVar28),
                                                   iVar19,local_170._0_4_,&local_178,type,3,0);
                                        uVar25 = t1->w;
                                        uVar17 = local_38;
                                        uVar24 = local_170._0_4_;
                                      }
                                      poVar16 = poVar16 + 1;
                                      uVar28 = uVar28 + 1;
                                    } while (uVar28 < uVar25);
                                    uVar28 = t1->h;
                                    uVar21 = uVar25;
                                  }
                                  poVar16 = poVar16 + 2;
                                  uVar13 = (int)uVar17 + 4;
                                  uVar17 = (ulong)uVar13;
                                  local_150 = CONCAT44(local_150._4_4_,(int)local_150 + 4);
                                  local_158 = local_158 + 4;
                                  local_11c = local_11c + 4;
                                } while (uVar13 < (uVar28 & 0xfffffffc));
                              }
                              if ((uVar13 < uVar28) && (uVar25 != 0)) {
                                uVar21 = 0;
                                do {
                                  uVar17 = local_b0;
                                  if ((*poVar16 != 0) && (uVar13 < uVar28)) {
                                    OVar14 = 0;
                                    do {
                                      opj_t1_enc_sigpass_step
                                                (t1,poVar16,
                                                 t1->data +
                                                 ((uVar13 + OVar14) * t1->data_stride + uVar21),
                                                 iVar19,uVar24,&local_178,(OPJ_BYTE)local_160,OVar14
                                                 ,(uint)(OVar14 == 0 && (int)uVar17 != 0));
                                      uVar28 = t1->h;
                                      iVar20 = uVar13 + OVar14;
                                      OVar14 = OVar14 + 1;
                                      uVar24 = local_170._0_4_;
                                    } while (iVar20 + 1U < uVar28);
                                    uVar25 = t1->w;
                                  }
                                  poVar16 = poVar16 + 1;
                                  uVar21 = uVar21 + 1;
                                } while (uVar21 < uVar25);
                              }
                            }
                            OVar9 = local_178;
                            local_170 = 1.0;
                            if (local_162 != '\0') {
                              local_170 = local_d0[local_d8];
                            }
                            if ((char)local_58 == '\0') {
                              dVar36 = (double)opj_dwt_getnorm_real(local_124,local_120);
                            }
                            else {
                              dVar36 = (double)opj_dwt_getnorm(local_124,local_120);
                            }
                            poVar6 = local_c0 + (local_b8 & 0xffffffff);
                            dVar36 = (double)(1 << (bVar12 & 0x1f)) *
                                     (double)local_170 * dVar36 * local_50;
                            dVar36 = (double)OVar9 * dVar36 * 0.0001220703125 * dVar36;
                            local_c8 = local_c8 + dVar36;
                            local_f8->distotile =
                                 (OPJ_FLOAT64)(dVar36 + (double)local_f8->distotile);
                            poVar6->distortiondec = (OPJ_FLOAT64)local_c8;
                            if ((((local_140 & 4) == 0) && (local_154 != 2 || iVar19 != 0)) &&
                               (((local_140 & 1) == 0 ||
                                (((local_154 != 2 || (*local_e0 - 4 != iVar19)) &&
                                 ((local_154 == 0 || ((int)(*local_e0 - 4) <= iVar19)))))))) {
                              if ((byte)local_174 == '\0') {
                                OVar11 = 3;
                              }
                              else {
                                OVar11 = opj_mqc_bypass_get_extra_bytes(&t1->mqc,local_144);
                              }
                              poVar6->field_0x14 = poVar6->field_0x14 & 0xfe;
                              OVar14 = opj_mqc_numbytes(&t1->mqc);
                              OVar14 = OVar14 + OVar11;
                            }
                            else {
                              if ((byte)local_174 == '\0') {
                                if (local_144 == 0) {
                                  opj_mqc_flush(&t1->mqc);
                                }
                                else {
                                  opj_mqc_erterm_enc(&t1->mqc);
                                }
                              }
                              else {
                                opj_mqc_bypass_flush_enc(&t1->mqc,local_144);
                              }
                              poVar6->field_0x14 = poVar6->field_0x14 | 1;
                              OVar14 = opj_mqc_numbytes(&t1->mqc);
                            }
                            uVar24 = local_154 + 1;
                            uVar25 = uVar24;
                            if (uVar24 == 3) {
                              uVar25 = 0;
                            }
                            poVar6->rate = OVar14;
                            if ((local_140 & 2) != 0) {
                              opj_mqc_reset_enc(&t1->mqc);
                            }
                            poVar32 = local_100;
                            poVar5 = local_130;
                            iVar19 = iVar19 - (uint)(uVar24 == 3);
                            uVar24 = (int)local_b8 + 1;
                            uVar17 = (ulong)uVar24;
                            ppoVar33 = local_110;
                          } while (-1 < iVar19);
                          local_130->totalpasses = uVar24;
                          if (uVar24 != 0) {
                            uVar25 = opj_mqc_numbytes(&t1->mqc);
                            if ((ulong)poVar5->totalpasses != 0) {
                              poVar6 = poVar5->passes;
                              lVar26 = (ulong)poVar5->totalpasses * 0x18;
                              lVar23 = lVar26;
                              do {
                                uVar24 = *(uint *)((long)&poVar6[-1].rate + lVar23);
                                if (uVar25 < uVar24) {
                                  *(uint *)((long)&poVar6[-1].rate + lVar23) = uVar25;
                                  uVar24 = uVar25;
                                }
                                uVar25 = uVar24;
                                lVar23 = lVar23 + -0x18;
                              } while (lVar23 != 0);
                              lVar23 = 0;
                              do {
                                uVar25 = *(uint *)((long)&poVar6->rate + lVar23);
                                if (uVar25 == 0) {
                                  __assert_fail("pass->rate > 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                                                ,0x966,
                                                "void opj_t1_encode_cblk(opj_t1_t *, opj_tcd_cblk_enc_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_FLOAT64, OPJ_UINT32, OPJ_UINT32, opj_tcd_tile_t *, const OPJ_FLOAT64 *, OPJ_UINT32)"
                                               );
                                }
                                uVar24 = uVar25 - 1;
                                if (poVar5->data[uVar24] == 0xff) {
                                  *(uint *)((long)&poVar6->rate + lVar23) = uVar24;
                                  uVar25 = uVar24;
                                }
                                if (lVar23 == 0) {
                                  iVar19 = 0;
                                }
                                else {
                                  iVar19 = *(int *)((long)&poVar6[-1].rate + lVar23);
                                }
                                *(uint *)((long)&poVar6->len + lVar23) = uVar25 - iVar19;
                                lVar23 = lVar23 + 0x18;
                              } while (lVar26 != lVar23);
                            }
                          }
                        }
                        uVar29 = local_60 + 1;
                      } while (uVar29 < local_68->ch * local_68->cw);
                      OVar14 = local_108->pw;
                      OVar11 = local_108->ph;
                      uVar17 = local_90;
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 < OVar11 * OVar14);
                }
              }
              local_80 = local_80 + 1;
            } while (local_80 < local_108->numbands);
            uVar24 = poVar32->numresolutions;
            tcp = local_a0;
            uVar17 = local_a8;
            uVar29 = local_d8;
          }
          local_98 = local_98 + 1;
        } while (local_98 < uVar24);
        uVar25 = local_f8->numcomps;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < uVar25);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,
                             opj_tcd_tile_t *tile,
                             opj_tcp_t *tcp,
                             const OPJ_FLOAT64 * mct_norms,
                             OPJ_UINT32 mct_numcomps
                            )
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;

    tile->distotile = 0;        /* fixed_quality */

    for (compno = 0; compno < tile->numcomps; ++compno) {
        opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
        opj_tccp_t* tccp = &tcp->tccps[compno];
        OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

        for (resno = 0; resno < tilec->numresolutions; ++resno) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; ++bandno) {
                opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];
                OPJ_INT32 bandconst;

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                bandconst = 8192 * 8192 / ((OPJ_INT32) floor(band->stepsize * 8192));
                for (precno = 0; precno < res->pw * res->ph; ++precno) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
                        opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
                        OPJ_INT32* OPJ_RESTRICT tiledp;
                        OPJ_UINT32 cblk_w;
                        OPJ_UINT32 cblk_h;
                        OPJ_UINT32 i, j, tileLineAdvance;
                        OPJ_SIZE_T tileIndex = 0;

                        OPJ_INT32 x = cblk->x0 - band->x0;
                        OPJ_INT32 y = cblk->y0 - band->y0;
                        if (band->bandno & 1) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            x += pres->x1 - pres->x0;
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            y += pres->y1 - pres->y0;
                        }

                        if (!opj_t1_allocate_buffers(
                                    t1,
                                    (OPJ_UINT32)(cblk->x1 - cblk->x0),
                                    (OPJ_UINT32)(cblk->y1 - cblk->y0))) {
                            return OPJ_FALSE;
                        }

                        cblk_w = t1->w;
                        cblk_h = t1->h;
                        tileLineAdvance = tile_w - cblk_w;

                        tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w + (OPJ_SIZE_T)x];
                        t1->data = tiledp;
                        t1->data_stride = tile_w;
                        if (tccp->qmfbid == 1) {
                            /* Do multiplication on unsigned type, even if the
                             * underlying type is signed, to avoid potential
                             * int overflow on large value (the output will be
                             * incorrect in such situation, but whatever...)
                             * This assumes complement-to-2 signed integer
                             * representation
                             * Fixes https://github.com/uclouvain/openjpeg/issues/1053
                             */
                            OPJ_UINT32* OPJ_RESTRICT tiledp_u = (OPJ_UINT32*) tiledp;
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    tiledp_u[tileIndex] <<= T1_NMSEDEC_FRACBITS;
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        } else {        /* if (tccp->qmfbid == 0) */
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    OPJ_INT32 tmp = tiledp[tileIndex];
                                    tiledp[tileIndex] =
                                        opj_int_fix_mul_t1(
                                            tmp,
                                            bandconst);
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        }

                        opj_t1_encode_cblk(
                            t1,
                            cblk,
                            band->bandno,
                            compno,
                            tilec->numresolutions - 1 - resno,
                            tccp->qmfbid,
                            band->stepsize,
                            tccp->cblksty,
                            tile->numcomps,
                            tile,
                            mct_norms,
                            mct_numcomps);

                    } /* cblkno */
                } /* precno */
            } /* bandno */
        } /* resno  */
    } /* compno  */
    return OPJ_TRUE;
}